

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderstyle.cpp
# Opt level: O3

double GetAlpha(int type,double alpha)

{
  if (type == 3) {
    alpha = 1.0 - alpha;
  }
  else if ((type != 2) && (alpha = 0.0, type == 1)) {
    return 65536.0;
  }
  return alpha;
}

Assistant:

double GetAlpha(int type, double alpha)
{
	switch (type)
	{
	case STYLEALPHA_Zero:		return 0;
	case STYLEALPHA_One:		return OPAQUE;
	case STYLEALPHA_Src:		return alpha;
	case STYLEALPHA_InvSrc:		return 1. - alpha;
	default:					return 0;
	}
}